

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O2

int32_t rcvbuf2q(NMQ *q)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  dlist_s *pdVar4;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  dlist_s *node;
  
  node = (q->rcv_buf).next;
  while ((node != &q->rcv_buf && (uVar3 = *(uint32_t *)&node[2].next, uVar3 == q->rcv_nxt))) {
    pdVar4 = node->next;
    q->rcv_sn_to_node[(ulong)(q->MAX_RCV_BUF_NUM + uVar3) % (ulong)q->MAX_RCV_BUF_NUM] =
         (dlnode *)0x0;
    uVar1 = q->nrcv_que;
    uVar2 = q->nrcv_buf;
    q->nrcv_que = uVar1 + 1;
    q->nrcv_buf = uVar2 + -1;
    q->rcv_nxt = uVar3 + 1;
    dlist_remove_node(node);
    dlist_add_tail(&q->rcv_que,node);
    in_RAX = extraout_RAX;
    node = pdVar4;
  }
  return (int32_t)in_RAX;
}

Assistant:

static int32_t rcvbuf2q(NMQ *q) {
    int32_t tot = 0;
    dlnode *node = 0, *nxt = 0;
    FOR_EACH(node, nxt, &q->rcv_buf) {
        segment *s = ADDRESS_FOR(segment, head, node);
        if (s->sn == q->rcv_nxt) {
            q->rcv_sn_to_node[modsn(s->sn, q->MAX_RCV_BUF_NUM)] = NULL;
            segment *seg = ADDRESS_FOR(segment, head, node);
            q->nrcv_que++;
            q->nrcv_buf--;
            q->rcv_nxt++;
            dlist_remove_node(node);
            dlist_add_tail(&q->rcv_que, node);
            tot += seg->len;
        } else {
            break;
        }
    }
    return tot;
}